

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Regex.cpp
# Opt level: O0

void __thiscall Regex::~Regex(Regex *this)

{
  Regex *this_local;
  
  RegexPrepareError::~RegexPrepareError(&this->mErrorData);
  JetHead::vector<Regex::GroupData>::~vector(&this->mGroups);
  Element::~Element(&this->mRoot);
  return;
}

Assistant:

Regex::~Regex()
{
}